

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O0

void capnp::compiler::anon_unknown_0::checkExampleStruct(Reader reader,uint sharedOrdinalCount)

{
  uint *__return_storage_ptr__;
  Reader reader_00;
  Reader reader_01;
  Field field_00;
  Field field_01;
  Field field_02;
  Field field_03;
  bool bVar1;
  uint uVar2;
  Iterator IVar3;
  undefined8 in_stack_fffffffffffffcb8;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  Field local_270;
  undefined1 local_230 [8];
  Field field_1;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  uint local_1ac;
  undefined1 local_1a8 [4];
  uint range;
  FieldSubset unionFields;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined1 local_e8 [8];
  Field field;
  undefined1 local_98 [8];
  Iterator __end2;
  undefined1 local_78 [8];
  Iterator __begin2;
  FieldSubset *__range2;
  StructSchema schema;
  uint sharedOrdinalCount_local;
  
  schema.super_Schema.raw._4_4_ = sharedOrdinalCount;
  __range2 = (FieldSubset *)DynamicStruct::Reader::getSchema(&reader);
  __return_storage_ptr__ = &__begin2.index;
  StructSchema::getNonUnionFields((FieldSubset *)__return_storage_ptr__,(StructSchema *)&__range2);
  IVar3 = StructSchema::FieldSubset::begin((FieldSubset *)__return_storage_ptr__);
  __end2._8_8_ = IVar3.container;
  __begin2.container._0_4_ = IVar3.index;
  local_78 = (undefined1  [8])__end2._8_8_;
  IVar3 = StructSchema::FieldSubset::end((FieldSubset *)__return_storage_ptr__);
  field.proto._reader._40_8_ = IVar3.container;
  __end2.container._0_4_ = IVar3.index;
  local_98 = (undefined1  [8])field.proto._reader._40_8_;
  while( true ) {
    bVar1 = capnp::_::
            IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>::
            operator==((IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                        *)local_78,
                       (IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                        *)local_98);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    capnp::_::IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>::
    operator*((Field *)local_e8,
              (IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
               *)local_78);
    memcpy(&local_120,&reader,0x38);
    memcpy(&unionFields.size_,local_e8,0x40);
    reader_00.reader.segment = (SegmentReader *)uStack_118;
    reader_00.schema.super_Schema.raw = (Schema)(Schema)local_120;
    reader_00.reader.capTable = (CapTableReader *)local_110;
    reader_00.reader.data = (void *)uStack_108;
    reader_00.reader.pointers = (WirePointer *)local_100;
    reader_00.reader.dataSize = (undefined4)uStack_f8;
    reader_00.reader.pointerCount = uStack_f8._4_2_;
    reader_00.reader._38_2_ = uStack_f8._6_2_;
    reader_00.reader._40_8_ = local_f0;
    field_02._8_8_ = uStack_158;
    field_02.parent.super_Schema.raw = (Schema)(Schema)unionFields._64_8_;
    field_02.proto._reader.segment = (SegmentReader *)local_150;
    field_02.proto._reader.capTable = (CapTableReader *)uStack_148;
    field_02.proto._reader.data = (void *)local_140;
    field_02.proto._reader.pointers = (WirePointer *)uStack_138;
    field_02.proto._reader._32_8_ = local_130;
    field_02.proto._reader._40_8_ = uStack_128;
    in_stack_fffffffffffffcb8 = uStack_158;
    checkExampleField(reader_00,field_02,schema.super_Schema.raw._4_4_);
    capnp::_::IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>::
    operator++((IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                *)local_78);
  }
  StructSchema::getUnionFields((FieldSubset *)local_1a8,(StructSchema *)&__range2);
  local_1ac = StructSchema::FieldSubset::size((FieldSubset *)local_1a8);
  while( true ) {
    bVar1 = false;
    if (local_1ac != 0) {
      StructSchema::FieldSubset::operator[]
                ((Field *)&field_1.proto._reader.nestingLimit,(FieldSubset *)local_1a8,local_1ac - 1
                );
      field_00._8_8_ = local_1e0;
      field_00.parent.super_Schema.raw = (Schema)(Schema)uStack_1e8;
      field_00.proto._reader.segment = (SegmentReader *)uStack_1d8;
      field_00.proto._reader.capTable = (CapTableReader *)local_1d0;
      field_00.proto._reader.data = (void *)uStack_1c8;
      field_00.proto._reader.pointers = (WirePointer *)local_1c0;
      field_00.proto._reader._32_8_ = uStack_1b8;
      field_00.proto._reader._40_8_ = in_stack_fffffffffffffcb8;
      uVar2 = getOrdinal(field_00);
      bVar1 = schema.super_Schema.raw._4_4_ <= uVar2;
    }
    if (!bVar1) break;
    local_1ac = local_1ac - 1;
  }
  if (local_1ac != 0) {
    StructSchema::FieldSubset::operator[](&local_270,(FieldSubset *)local_1a8,0);
    field_01._8_8_ = local_270.proto._reader.segment;
    field_01.parent.super_Schema.raw = (Schema)(Schema)local_270._8_8_;
    field_01.proto._reader.segment = (SegmentReader *)local_270.proto._reader.capTable;
    field_01.proto._reader.capTable = (CapTableReader *)local_270.proto._reader.data;
    field_01.proto._reader.data = local_270.proto._reader.pointers;
    field_01.proto._reader.pointers = (WirePointer *)local_270.proto._reader._32_8_;
    field_01.proto._reader.dataSize = local_270.proto._reader.nestingLimit;
    field_01.proto._reader.pointerCount = local_270.proto._reader._44_2_;
    field_01.proto._reader._38_2_ = local_270.proto._reader._46_2_;
    field_01.proto._reader._40_8_ = in_stack_fffffffffffffcb8;
    uVar2 = getOrdinal(field_01);
    StructSchema::FieldSubset::operator[]
              ((Field *)local_230,(FieldSubset *)local_1a8,uVar2 % local_1ac);
    memcpy(&local_2a8,&reader,0x38);
    memcpy(&local_2e8,local_230,0x40);
    reader_01.reader.segment = (SegmentReader *)uStack_2a0;
    reader_01.schema.super_Schema.raw = (Schema)(Schema)local_2a8;
    reader_01.reader.capTable = (CapTableReader *)local_298;
    reader_01.reader.data = (void *)uStack_290;
    reader_01.reader.pointers = (WirePointer *)local_288;
    reader_01.reader.dataSize = (undefined4)uStack_280;
    reader_01.reader.pointerCount = uStack_280._4_2_;
    reader_01.reader._38_2_ = uStack_280._6_2_;
    reader_01.reader._40_8_ = local_278;
    field_03._8_8_ = uStack_2e0;
    field_03.parent.super_Schema.raw = (Schema)(Schema)local_2e8;
    field_03.proto._reader.segment = (SegmentReader *)local_2d8;
    field_03.proto._reader.capTable = (CapTableReader *)uStack_2d0;
    field_03.proto._reader.data = (void *)local_2c8;
    field_03.proto._reader.pointers = (WirePointer *)uStack_2c0;
    field_03.proto._reader.dataSize = (undefined4)local_2b8;
    field_03.proto._reader.pointerCount = local_2b8._4_2_;
    field_03.proto._reader._38_2_ = local_2b8._6_2_;
    field_03.proto._reader._40_8_ = uStack_2b0;
    checkExampleField(reader_01,field_03,schema.super_Schema.raw._4_4_);
  }
  return;
}

Assistant:

void checkExampleStruct(DynamicStruct::Reader reader, uint sharedOrdinalCount) {
  auto schema = reader.getSchema();

  for (auto field: schema.getNonUnionFields()) {
    checkExampleField(reader, field, sharedOrdinalCount);
  }

  auto unionFields = schema.getUnionFields();

  // Pretend the union doesn't have any fields that aren't in the shared ordinal range.
  uint range = unionFields.size();
  while (range > 0 && getOrdinal(unionFields[range - 1]) >= sharedOrdinalCount) {
    --range;
  }

  if (range > 0) {
    auto field = unionFields[getOrdinal(unionFields[0]) % range];
    checkExampleField(reader, field, sharedOrdinalCount);
  }
}